

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (string *__return_storage_ptr__,Json *this,char *value,uint length)

{
  Json *pJVar1;
  Json JVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  ostream *poVar5;
  ulong uVar6;
  Json *pJVar7;
  long lVar8;
  ulong uVar9;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream oss;
  
  if (this == (Json *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&oss);
  }
  else {
    uVar9 = (ulong)value & 0xffffffff;
    for (pJVar7 = this; pJVar7 < this + uVar9; pJVar7 = pJVar7 + 1) {
      lVar8 = 0;
      while (lVar8 != 7) {
        pJVar1 = (Json *)("\"\\\b\f\n\r\t" + lVar8);
        lVar8 = lVar8 + 1;
        if (*pJVar1 == *pJVar7) goto LAB_003cfcba;
      }
    }
    uVar6 = 0;
    do {
      if (uVar9 == uVar6) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"\"",&local_1c9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                       &local_1c8,(char *)this);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                       "\"");
        std::__cxx11::string::~string((string *)&oss);
        std::__cxx11::string::~string((string *)&local_1c8);
        return __return_storage_ptr__;
      }
      pJVar7 = this + uVar6;
      uVar6 = uVar6 + 1;
    } while (0x1f < (byte)*pJVar7);
LAB_003cfcba:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      JVar2 = this[uVar6];
      switch(JVar2) {
      case (Json)0x8:
        break;
      case (Json)0x9:
        break;
      case (Json)0xa:
        break;
      case (Json)0xb:
switchD_003cfd10_caseD_b:
        if ((byte)JVar2 < 0x20) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar5 = std::operator<<((ostream *)&oss,"\\u");
          pp_Var3 = poVar5->_vptr_basic_ostream;
          p_Var4 = pp_Var3[-3];
          *(uint *)(&poVar5->field_0x18 + (long)p_Var4) =
               *(uint *)(&poVar5->field_0x18 + (long)p_Var4) & 0xffffffb5 | 8;
          *(uint *)(&poVar5->field_0x18 + (long)pp_Var3[-3]) =
               *(uint *)(&poVar5->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
          poVar5 = std::operator<<(poVar5,0x30);
          *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 4;
          std::ostream::operator<<(poVar5,(int)(char)this[uVar6]);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        goto LAB_003cfe07;
      case (Json)0xc:
        break;
      case (Json)0xd:
        break;
      default:
        if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_003cfd10_caseD_b;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_003cfe07:
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static JSONCPP_STRING valueToQuotedStringN(const char* value, unsigned length) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strnpbrk(value, "\"\\\b\f\n\r\t", length) == NULL &&
      !containsControlCharacter0(value, length))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      length * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if ((isControlCharacter(*c)) || (*c == 0)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}